

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# check_op.h
# Opt level: O1

Nonnull<const_char_*>
absl::lts_20250127::log_internal::MakeCheckOpString<unsigned_long,unsigned_char>
          (unsigned_long v1,uchar v2,Nonnull<const_char_*> exprtext)

{
  ostream *os;
  Nonnull<const_char_*> pcVar1;
  CheckOpMessageBuilder comb;
  undefined1 local_190 [376];
  
  CheckOpMessageBuilder::CheckOpMessageBuilder((CheckOpMessageBuilder *)local_190,exprtext);
  std::ostream::_M_insert<unsigned_long>((ulong)local_190);
  os = CheckOpMessageBuilder::ForVar2((CheckOpMessageBuilder *)local_190);
  MakeCheckOpValueString(os,v2);
  pcVar1 = CheckOpMessageBuilder::NewString((CheckOpMessageBuilder *)local_190);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_190);
  std::ios_base::~ios_base((ios_base *)(local_190 + 0x70));
  return pcVar1;
}

Assistant:

absl::Nonnull<const char*> MakeCheckOpString(
    T1 v1, T2 v2, absl::Nonnull<const char*> exprtext) {
  CheckOpMessageBuilder comb(exprtext);
  MakeCheckOpValueString(comb.ForVar1(), v1);
  MakeCheckOpValueString(comb.ForVar2(), v2);
  return comb.NewString();
}